

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIIntDecoder::decode(FIIntDecoder *this,uint8_t *data,size_t len)

{
  uint uVar1;
  DeadlyImportError *this_00;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar2;
  undefined1 local_78 [28];
  int32_t v;
  size_t i;
  size_t numInts;
  vector<int,_std::allocator<int>_> value;
  size_t len_local;
  uint8_t *data_local;
  FIIntDecoder *this_local;
  
  if ((in_RCX & 3) != 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&numInts);
  i = in_RCX >> 2;
  std::vector<int,_std::allocator<int>_>::reserve((vector<int,_std::allocator<int>_> *)&numInts,i);
  len_local = len;
  for (stack0xffffffffffffffa0 = (pointer)0x0; stack0xffffffffffffffa0 < i;
      register0x00000000 = (pointer)((long)stack0xffffffffffffffa0 + 1)) {
    uVar1 = *(uint *)len_local;
    local_78._20_4_ =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&numInts,
               (value_type_conflict4 *)(local_78 + 0x14));
    len_local = len_local + 4;
  }
  FIIntValue::create((FIIntValue *)local_78,(vector<int,_std::allocator<int>_> *)&numInts);
  std::shared_ptr<Assimp::FIValue_const>::shared_ptr<Assimp::FIIntValue,void>
            ((shared_ptr<Assimp::FIValue_const> *)this,(shared_ptr<Assimp::FIIntValue> *)local_78);
  std::shared_ptr<Assimp::FIIntValue>::~shared_ptr((shared_ptr<Assimp::FIIntValue> *)local_78);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&numInts);
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 3) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<int32_t> value;
        size_t numInts = len / 4;
        value.reserve(numInts);
        for (size_t i = 0; i < numInts; ++i) {
            int32_t v = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
            value.push_back(v);
            data += 4;
        }
        return FIIntValue::create(std::move(value));
    }